

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

int __thiscall nite::UDPSocket::open(UDPSocket *this,char *__file,int __oflag,...)

{
  int iVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  int number;
  int number_00;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_2c [8];
  sockaddr_in addr;
  uint16_t port_local;
  UDPSocket *this_local;
  
  addr.sin_zero._2_2_ = SUB82(__file,0);
  this->port = addr.sin_zero._2_2_;
  unique0x100002e3 = this;
  iVar1 = socket(2,2,0x11);
  this->sock = iVar1;
  if (iVar1 < 0) {
    print("failed to create UDP socket");
    this_local._7_1_ = 0;
    uVar2 = extraout_RAX;
  }
  else {
    local_2c._0_2_ = 2;
    local_2c[4] = '\0';
    local_2c[5] = '\0';
    local_2c[6] = '\0';
    local_2c[7] = '\0';
    local_2c._2_2_ = htons(addr.sin_zero._2_2_);
    iVar1 = bind(this->sock,(sockaddr *)local_2c,0x10);
    if (iVar1 < 1) {
      this->opened = true;
      toStr_abi_cxx11_(&local_120,(nite *)(ulong)(ushort)addr.sin_zero._2_2_,number);
      std::operator+(&local_100,"UDP socket opened at ",&local_120);
      std::operator+(&local_e0,&local_100," (");
      toStr_abi_cxx11_(&local_140,(nite *)(ulong)(uint)this->sock,number_00);
      std::operator+(&local_c0,&local_e0,&local_140);
      std::operator+(&local_a0,&local_c0,")");
      print(&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      uVar2 = std::__cxx11::string::~string((string *)&local_120);
      this_local._7_1_ = 1;
    }
    else {
      toStr_abi_cxx11_(&local_70,(nite *)(ulong)(ushort)addr.sin_zero._2_2_,number);
      std::operator+(&local_50,"failed to bind UDP socket to port ",&local_70);
      print(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      close_(this->sock);
      this_local._7_1_ = 0;
      uVar2 = extraout_RAX_00;
    }
  }
  return (int)CONCAT71((int7)((ulong)uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool nite::UDPSocket::open(UInt16 port){
	this->port = port;
	if((sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP)) < 0){
		nite::print("failed to create UDP socket"); // TODO: add proper error handling
		return false;
	}
	sockaddr_in addr;
	addr.sin_family = AF_INET;
	addr.sin_addr.s_addr = INADDR_ANY;
	addr.sin_port = htons(port);
	if (bind(sock, (const sockaddr*) &addr, sizeof(sockaddr_in)) > 0){
 		nite::print("failed to bind UDP socket to port "+nite::toStr(port)); // TODO: add proper error handling
		close_(sock);
		return false;
	}
	opened = true;
	nite::print("UDP socket opened at "+nite::toStr(port)+" ("+nite::toStr(sock)+")");
	return true;
}